

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Generator.hpp
# Opt level: O1

unique_ptr<double,_std::default_delete<double>_> __thiscall
strq::Generator<std::unique_ptr<double,std::default_delete<double>>,void>::operator()
          (Generator<std::unique_ptr<double,std::default_delete<double>>,void> *this,
          Compound<strq::Arithmetic<std::normal_distribution<double>_>_> *schema)

{
  double dVar1;
  double *pdVar2;
  normal_distribution<double> *in_RDX;
  Generator<double,void> local_19;
  
  pdVar2 = (double *)operator_new(8);
  dVar1 = Generator<double,void>::operator()
                    (&local_19,(Arithmetic<std::normal_distribution<double>_>)*in_RDX);
  *pdVar2 = dVar1;
  *(double **)this = pdVar2;
  return (__uniq_ptr_data<double,_std::default_delete<double>,_true,_true>)
         (__uniq_ptr_data<double,_std::default_delete<double>,_true,_true>)this;
}

Assistant:

auto operator() (Schema&& schema) -> T
        {
            return T {new typename T::element_type {
                    random<typename T::element_type>(std::get<0>(schema.values()))
            }};
        }